

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
          (EditingIterator *this)

{
  NodeBase *pNVar1;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  NodeBase *pNVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  
  pNVar6 = this->last;
  if (pNVar6 == (NodeBase *)0x0) {
    pNVar1 = (this->super_Iterator).current;
  }
  else {
    pNVar1 = (this->super_Iterator).current;
    if (pNVar6->next != pNVar1) goto LAB_004022c4;
  }
  pNVar6 = pNVar1;
  this->last = pNVar6;
  if (pNVar6 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pNVar6 = (this->super_Iterator).current;
  }
LAB_004022c4:
  pSVar2 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)pNVar6->next;
  bVar4 = pSVar2 != (this->super_Iterator).list;
  pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  if (bVar4) {
    pSVar7 = pSVar2;
  }
  (this->super_Iterator).current = &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>;
  return bVar4;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }